

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O0

void json2map_hookMethod(void *data,char *key,char *value)

{
  int iVar1;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  keyvalue_t *list;
  int i;
  char *local_28;
  
  local_28 = in_RDI;
  while( true ) {
    iVar1 = strcmp(local_28,"");
    if (iVar1 == 0) break;
    local_28 = local_28 + 0x1fe;
  }
  strcpy(local_28,in_RSI);
  strcpy(local_28 + 0xff,in_RDX);
  return;
}

Assistant:

void json2map_hookMethod(void *data, char *key, char *value) {
	int i;
	keyvalue_t *list = (keyvalue_t *) data;

	i = 0;
	while ( strcmp(list->key, "") ) {
		i++;
		list++;
	}
	strcpy(list->key, key);
	strcpy(list->value, value);
}